

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.h
# Opt level: O2

void __thiscall vpl::Scope::CallFunction(Scope *this,string *name)

{
  pointer pNVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  long lVar4;
  int iVar5;
  bool *pbVar6;
  pointer pFVar7;
  size_t i;
  ulong uVar8;
  bool bVar9;
  
  poVar2 = std::operator<<(this->out_,'#');
  poVar2 = std::operator<<(poVar2,"void vpl::Scope::CallFunction(const std::string &)");
  std::operator<<(poVar2,'\n');
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->func_name_map_,name);
  pNVar1 = (this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = ((long)(this->scopes_).super__Vector_base<vpl::NameScope,_std::allocator<vpl::NameScope>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x48;
  pbVar6 = &pNVar1->is_global_;
  iVar5 = 0;
  while (bVar9 = lVar4 != 0, lVar4 = lVar4 + -1, bVar9) {
    if (*pbVar6 == false) {
      iVar5 = iVar5 + ((NameScope *)(pbVar6 + -0x40))->total_size_;
    }
    pbVar6 = pbVar6 + 0x48;
  }
  pFVar7 = (this->functions_).super__Vector_base<vpl::Function,_std::allocator<vpl::Function>_>.
           _M_impl.super__Vector_impl_data._M_start + *pmVar3;
  poVar2 = std::operator<<(this->out_,"    push ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar5);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(this->out_,"    push %");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  std::operator<<(poVar2,'\n');
  std::operator<<(this->out_,"    add\n");
  poVar2 = std::operator<<(this->out_,"    pop %");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  std::operator<<(poVar2,'\n');
  for (uVar8 = 0;
      uVar8 < (ulong)((long)*(pointer *)
                             ((long)&(pFVar7->args_).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl + 8) -
                      *(long *)&(pFVar7->args_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl >> 5); uVar8 = uVar8 + 1) {
    poVar2 = std::operator<<(this->out_,"    pop !");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
    std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<(this->out_,"    push %");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
    std::operator<<(poVar2,'\n');
    std::operator<<(this->out_,"    push 1\n");
    std::operator<<(this->out_,"    add\n");
    poVar2 = std::operator<<(this->out_,"    pop %");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
    std::operator<<(poVar2,'\n');
    this->cur_stack_pos_ = this->cur_stack_pos_ + -1;
  }
  poVar2 = std::operator<<(this->out_,"    push %");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(this->out_,"    push ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::operator<<(this->out_,"    sub\n");
  poVar2 = std::operator<<(this->out_,"    pop %");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(this->out_,"    call ");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(this->out_,"    pop %");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<(this->out_,"    push %");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,3);
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void CallFunction(const std::string& name) {
        LOG
        Function* func = &functions_[func_name_map_[name]];

        int frame_size = 0;
        for (size_t i = 0; i < scopes_.size(); ++i) {
            if (!scopes_[i].IsGlobal()) {
                frame_size += scopes_[i].Size();
            }
        }

        out_ << "    push " << frame_size << '\n';
        out_ << "    push %" << StackPointerRegister() << '\n';
        out_ << "    add\n";
        out_ << "    pop %" << StackPointerRegister() << '\n';

        for (size_t i = 0; i < func->GetArgs().size(); ++i) {
            out_ << "    pop !" << StackPointerRegister() << '\n';
            out_ << "    push %" << StackPointerRegister() << '\n';
            out_ << "    push 1\n";
            out_ << "    add\n";
            out_ << "    pop %" << StackPointerRegister() << '\n';
            Pop();
        }
        out_ << "    push %" << StackPointerRegister() << '\n';
        out_ << "    push " << func->GetArgs().size() << "\n";
        out_ << "    sub\n";
        out_ << "    pop %" << StackPointerRegister() << '\n';

        out_ << "    call " << name << '\n';
        out_ << "    pop %" << StackPointerRegister() << '\n';
        out_ << "    push %" << RetRegister() << '\n';
    }